

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

cf_list_iter_t cf_list_find(cf_list_t *self,void *data,cf_alg_equal_f eqf)

{
  cf_bool_t cVar1;
  cf_list_iter_t local_58;
  cf_list_iter_t it;
  cf_alg_equal_f eqf_local;
  void *data_local;
  cf_list_t *self_local;
  
  local_58 = self->next;
  while( true ) {
    if (local_58 == self) {
      return (cf_list_iter_t)0x0;
    }
    cVar1 = (*eqf)(data,local_58->data);
    if (cVar1 != 0) break;
    local_58 = local_58->next;
  }
  return local_58;
}

Assistant:

cf_list_iter_t cf_list_find(cf_list_t* self, void* data, cf_alg_equal_f eqf) {
    cf_list_iter_t it = cf_list_iter_init(self);

    while (!cf_list_iter_end(self, it)) {
        if (eqf(data, cf_list_iter_data(it))) {
            return it;
        }

        it = cf_list_iter_next(it);
    }
    return CF_NULL_PTR;
}